

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smach.c
# Opt level: O0

float smach(char *cmach)

{
  int iVar1;
  undefined2 in_FPUControlWord;
  byte bVar2;
  int local_20;
  float local_1c;
  int argument;
  float rmach;
  float small;
  float sfmin;
  char *cmach_local;
  
  bVar2 = (byte)((ushort)in_FPUControlWord >> 8);
  _small = cmach;
  iVar1 = strncmp(cmach,"E",1);
  if (iVar1 == 0) {
    local_1c = 5.9604645e-08;
  }
  else {
    iVar1 = strncmp(_small,"S",1);
    if (iVar1 == 0) {
      local_1c = 1.1754944e-38;
    }
    else {
      iVar1 = strncmp(_small,"B",1);
      if (iVar1 == 0) {
        local_1c = 2.0;
      }
      else {
        iVar1 = strncmp(_small,"P",1);
        if (iVar1 == 0) {
          local_1c = 1.1920929e-07;
        }
        else {
          iVar1 = strncmp(_small,"N",1);
          if (iVar1 == 0) {
            local_1c = 24.0;
          }
          else {
            iVar1 = strncmp(_small,"R",1);
            if (iVar1 == 0) {
              local_1c = (float)(0x2dU >> (bVar2 >> 1 & 6) & 3);
            }
            else {
              iVar1 = strncmp(_small,"M",1);
              if (iVar1 == 0) {
                local_1c = -125.0;
              }
              else {
                iVar1 = strncmp(_small,"U",1);
                if (iVar1 == 0) {
                  local_1c = 1.1754944e-38;
                }
                else {
                  iVar1 = strncmp(_small,"L",1);
                  if (iVar1 == 0) {
                    local_1c = 128.0;
                  }
                  else {
                    iVar1 = strncmp(_small,"O",1);
                    if (iVar1 == 0) {
                      local_1c = 3.4028235e+38;
                    }
                    else {
                      local_20 = 0;
                      input_error("smach",&local_20);
                      local_1c = 0.0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_1c;
}

Assistant:

float smach(char *cmach)
{
/*  -- SuperLU auxiliary routine (version 5.0) --   
    This uses C99 standard constants, and is thread safe.

    Must be compiled with "-std=c99" flag.


    Purpose   
    =======   

    SMACH returns single precision machine parameters.   

    Arguments   
    =========   

    CMACH   (input) CHARACTER*1   
            Specifies the value to be returned by SMACH:   
            = 'E' or 'e',   SMACH := eps   
            = 'S' or 's ,   SMACH := sfmin   
            = 'B' or 'b',   SMACH := base   
            = 'P' or 'p',   SMACH := eps*base   
            = 'N' or 'n',   SMACH := t   
            = 'R' or 'r',   SMACH := rnd   
            = 'M' or 'm',   SMACH := emin   
            = 'U' or 'u',   SMACH := rmin   
            = 'L' or 'l',   SMACH := emax   
            = 'O' or 'o',   SMACH := rmax   

            where   

            eps   = relative machine precision   
            sfmin = safe minimum, such that 1/sfmin does not overflow   
            base  = base of the machine   
            prec  = eps*base   
            t     = number of (base) digits in the mantissa   
            rnd   = 1.0 when rounding occurs in addition, 0.0 otherwise   
            emin  = minimum exponent before (gradual) underflow   
            rmin  = underflow threshold - base**(emin-1)   
            emax  = largest exponent before overflow   
            rmax  = overflow threshold  - (base**emax)*(1-eps)   

   ===================================================================== 
*/

    float sfmin, small, rmach;

    if (strncmp(cmach, "E", 1)==0) {
	rmach = FLT_EPSILON * 0.5;
    } else if (strncmp(cmach, "S", 1)==0) {
	sfmin = FLT_MIN;
	small = 1. / FLT_MAX;
	if (small >= sfmin) {
	    /* Use SMALL plus a bit, to avoid the possibility of rounding   
	       causing overflow when computing  1/sfmin. */
	    sfmin = small * (FLT_EPSILON*0.5 + 1.);
	}
	rmach = sfmin;
    } else if (strncmp(cmach, "B", 1)==0) {
	rmach = FLT_RADIX;
    } else if (strncmp(cmach, "P", 1)==0) {
	rmach = FLT_EPSILON * 0.5 * FLT_RADIX;
    } else if (strncmp(cmach, "N", 1)==0) {
	rmach = FLT_MANT_DIG;
    } else if (strncmp(cmach, "R", 1)==0) {
	rmach = FLT_ROUNDS;
    } else if (strncmp(cmach, "M", 1)==0) {
	rmach = FLT_MIN_EXP;
    } else if (strncmp(cmach, "U", 1)==0) {
	rmach = FLT_MIN;
    } else if (strncmp(cmach, "L", 1)==0) {
	rmach = FLT_MAX_EXP;
    } else if (strncmp(cmach, "O", 1)==0) {
	rmach = FLT_MAX;
    } else {
        int argument = 0;
        input_error("smach", &argument);
        rmach = 0;
    }

    return rmach;

}